

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2019::DataTransform<sptk::int24_t,_sptk::int24_t>::~DataTransform
          (DataTransform<sptk::int24_t,_sptk::int24_t> *this)

{
  (this->super_DataTransformInterface)._vptr_DataTransformInterface =
       (_func_int **)&PTR__DataTransform_001539b8;
  std::__cxx11::string::~string((string *)&this->print_format_);
  return;
}

Assistant:

~DataTransform() override {
  }